

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_write_char_field_Test::TestBody(writer_test_should_write_char_field_Test *this)

{
  size_t __n;
  char *message;
  ostringstream local_1d0 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  internal local_38 [8];
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  gtest_ar.message_.ptr_._6_2_ = 0x34;
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_>_>::write
            ((int)local_1d0,(void *)((long)&gtest_ar.message_.ptr_ + 6),__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_38,"oss.str()","\"39=4|\"",&local_58,(char (*) [6])"39=4|");
  std::__cxx11::string::~string((string *)&local_58);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  return;
}

Assistant:

TEST(writer_test, should_write_char_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::OrdStatus>;
    Field field;
    field.set('4');

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "39=4|");
}